

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
GGSock::Unserialize::operator()
          (Unserialize *this,
          map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
          *t,char *bufferData,size_t bufferSize,size_t *offset)

{
  bool bVar1;
  mapped_type *this_00;
  ulong *in_RCX;
  ulong in_RDX;
  FileInfo *in_RDI;
  FileInfo v;
  int k;
  int i;
  int32_t n;
  bool res;
  FileInfo *in_stack_ffffffffffffff48;
  char local_88 [8];
  FileInfo *in_stack_ffffffffffffff80;
  key_type *in_stack_ffffffffffffff88;
  map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  *in_stack_ffffffffffffff90;
  char local_38 [4];
  int local_34;
  int local_30;
  byte local_29;
  ulong *local_20;
  ulong local_18;
  
  local_29 = 1;
  local_30 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = GGSock::Unserialize::operator()((int *)in_RDI,(char *)&local_30,in_RDX,in_RCX);
  local_29 = (local_29 & 1 & bVar1) != 0;
  for (local_34 = 0; local_34 < local_30; local_34 = local_34 + 1) {
    FileServer::FileInfo::FileInfo(in_stack_ffffffffffffff80);
    bVar1 = GGSock::Unserialize::operator()((int *)in_RDI,local_38,local_18,local_20);
    local_29 = bVar1 & local_29;
    bVar1 = GGSock::Unserialize::operator()(in_RDI,local_88,local_18,local_20);
    local_29 = bVar1 & local_29;
    this_00 = std::
              map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
              ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    FileServer::FileInfo::operator=(this_00,in_stack_ffffffffffffff48);
    FileServer::FileInfo::~FileInfo(this_00);
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool Unserialize::operator()(std::map<Key, Value> & t, const char * bufferData, size_t bufferSize, size_t & offset) {
    bool res = true;

    int32_t n = 0;
    res &= operator()(n, bufferData, bufferSize, offset);
    for (int i = 0; i < n; ++i) {
        Key k;
        Value v;
        res &= operator()(k, bufferData, bufferSize, offset);
        res &= operator()(v, bufferData, bufferSize, offset);
        t[k] = std::move(v);
    }

    return res;
}